

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O3

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CGetLengthExp *expression)

{
  IExpression *pIVar1;
  ISubtreeWrapper *pIVar2;
  ISubtreeWrapper *pIVar3;
  CMemExpression *this_00;
  CBinopExpression *this_01;
  CConstExpression *this_02;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_50;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CGetLength\n",0x18);
  pIVar1 = (expression->arrayIdentifier)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_38);
  pIVar3 = (ISubtreeWrapper *)operator_new(0x10);
  this_00 = (CMemExpression *)operator_new(0x10);
  this_01 = (CBinopExpression *)operator_new(0x20);
  local_48._M_head_impl = local_38._M_head_impl;
  this_02 = (CConstExpression *)operator_new(0x10);
  IRT::CConstExpression::CConstExpression(this_02,0);
  local_50._M_head_impl = (CExpression *)this_02;
  IRT::CBinopExpression::CBinopExpression
            (this_01,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_48,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_50,PLUS);
  local_40._M_head_impl = (CExpression *)this_01;
  IRT::CMemExpression::CMemExpression
            (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_40);
  pIVar3->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_00181498;
  pIVar3[1]._vptr_ISubtreeWrapper = (_func_int **)this_00;
  pIVar2 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar3;
  if (pIVar2 != (ISubtreeWrapper *)0x0) {
    operator_delete(pIVar2);
  }
  if ((CBinopExpression *)local_40._M_head_impl != (CBinopExpression *)0x0) {
    (*(((CExpression *)&(local_40._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_40._M_head_impl = (CExpression *)0x0;
  if ((CConstExpression *)local_50._M_head_impl != (CConstExpression *)0x0) {
    (*(((CExpression *)&(local_50._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_50._M_head_impl = (CExpression *)0x0;
  if (local_48._M_head_impl != (CExpression *)0x0) {
    (*((local_48._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CGetLengthExp &expression ) {
    std::cout << "IRT builder: CGetLength\n";
    expression.arrayIdentifier->Accept( *this );
    std::unique_ptr<const IRT::CExpression> containerExpression = std::move( wrapper->ToExpression( ));

    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            new IRT::CMemExpression(
                    std::move( std::unique_ptr<const IRT::CExpression>( new IRT::CBinopExpression(
                            std::move( containerExpression ),
                            std::move( std::unique_ptr<const IRT::CExpression>( new IRT::CConstExpression( 0 ))),
                            IRT::enums::TOperationType::PLUS
                                                                        )
                    )))
    ));

}